

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  std::__cxx11::string::operator=((string *)this,(string *)origin);
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::_M_move_assign(&this->zones_,&origin->zones_);
  std::__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
  operator=((__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             *)&this->global_zone_,
            (__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             *)&origin->global_zone_);
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFInstrument & SFInstrument::operator=(SFInstrument && origin) noexcept {
  // Copy fields.
  name_ = std::move(origin.name_);
  zones_ = std::move(origin.zones_);
  global_zone_ = std::move(origin.global_zone_);
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}